

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
CartesianProductGenerator<BLOCK_SIZE,_int,_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long),_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
::~CartesianProductGenerator
          (CartesianProductGenerator<BLOCK_SIZE,_int,_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long),_void_(*)(int,_int,_short_*,_long,_const_unsigned_char_*,_long,_const_unsigned_char_*,_long)>
           *this)

{
  ~CartesianProductGenerator(this);
  operator_delete(this);
  return;
}

Assistant:

~CartesianProductGenerator() override {}